

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.h
# Opt level: O2

bool UTF_uc32_to_uc8(UTF_UC32 uc32,UTF_UC8 *uc8)

{
  byte bVar1;
  
  if ((uint)uc32 < 0x110000) {
    bVar1 = (byte)uc32;
    if ((uint)uc32 < 0x80) {
      *uc8 = bVar1;
      uc8[1] = '\0';
    }
    else if ((uint)uc32 < 0x800) {
      *uc8 = (byte)((uint)uc32 >> 6) | 0xc0;
      uc8[1] = bVar1 & 0x3f | 0x80;
      uc8[2] = '\0';
    }
    else if ((uint)uc32 < 0x10000) {
      *uc8 = (byte)((uint)uc32 >> 0xc) | 0xe0;
      uc8[1] = (byte)((uint)uc32 >> 6) & 0x3f | 0x80;
      uc8[2] = bVar1 & 0x3f | 0x80;
      uc8[3] = '\0';
    }
    else {
      *uc8 = (byte)((uint)uc32 >> 0x12) | 0xf0;
      uc8[1] = (byte)((uint)uc32 >> 0xc) & 0x3f | 0x80;
      uc8[2] = (byte)((uint)uc32 >> 6) & 0x3f | 0x80;
      uc8[3] = bVar1 & 0x3f | 0x80;
    }
  }
  else {
    *uc8 = '\0';
  }
  return (uint)uc32 < 0x110000;
}

Assistant:

static __inline bool
UTF_uc32_to_uc8(UTF_UC32 uc32, UTF_UC8 uc8[4])
{
    if (uc32 > 0x10FFFF)
    {
        uc8[0] = 0;
        return false;
    }

    if (uc32 < 0x80)
    {
        uc8[0] = UTF_STATIC_CAST(UTF_UC8, uc32);
        uc8[1] = 0;
    }
    else if (uc32 < 0x800)
    {
        uc8[0] = 0xC0 | UTF_STATIC_CAST(UTF_UC8, uc32 >> 6);
        uc8[1] = 0x80 | (UTF_STATIC_CAST(UTF_UC8, uc32) & 0x3F);
        uc8[2] = 0;
    }
    else if (uc32 < 0x10000)
    {
        uc8[0] = 0xE0 | UTF_STATIC_CAST(UTF_UC8, uc32 >> 12);
        uc8[1] = 0x80 | (UTF_STATIC_CAST(UTF_UC8, uc32 >> 6) & 0x3F);
        uc8[2] = 0x80 | (UTF_STATIC_CAST(UTF_UC8, uc32) & 0x3F);
        uc8[3] = 0;
    }
    else
    {
        uc8[0] = 0xF0 | UTF_STATIC_CAST(UTF_UC8, uc32 >> 18);
        uc8[1] = 0x80 | (UTF_STATIC_CAST(UTF_UC8, uc32 >> 12) & 0x3F);
        uc8[2] = 0x80 | (UTF_STATIC_CAST(UTF_UC8, uc32 >> 6) & 0x3F);
        uc8[3] = 0x80 | (UTF_STATIC_CAST(UTF_UC8, uc32) & 0x3F);
    }

    return true;
}